

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_parse_same_option_twice_with_unique(void)

{
  int iVar1;
  uint uVar2;
  char *local_68;
  char *args [7];
  int j;
  int i;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&j,0,"program");
  if (iVar1 == 0) {
    memcpy(&local_68,&DAT_0013e3e0,0x38);
    uVar2 = cargo_add_option(_j,CARGO_OPT_UNIQUE,"--alpha -a","The alpha","i",(long)args + 0x34);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    uVar2 = cargo_add_option(_j,0,"--beta -b","The beta","i",args + 6);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse(_j,0,1,7,&local_68);
      printf("--alpha == %d\n",(ulong)args[6]._4_4_);
      if (cargo._4_4_ == 0) {
        pcStack_18 = "Succesfully parsed duplicate option";
      }
      else if (args[6]._4_4_ != 1) {
        pcStack_18 = "Expected --alpha to have value 1";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
    cargo_destroy((cargo_t *)&j);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_parse_same_option_twice_with_unique)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta", "4", "--alpha", "2" };

    ret |= cargo_add_option(cargo, CARGO_OPT_UNIQUE,
                                "--alpha -a", "The alpha", "i", &i);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("--alpha == %d\n", i);
    cargo_assert(ret != 0, "Succesfully parsed duplicate option");
    cargo_assert(i == 1, "Expected --alpha to have value 1");

    _TEST_CLEANUP();
}